

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constrained.cpp
# Opt level: O2

non_empty_string * func(non_empty_string *__return_storage_ptr__,non_empty_string *str)

{
  ostream *poVar1;
  value_type *pvVar2;
  constrained_modifier<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_type_safe::constraints::non_empty,_type_safe::assertion_verifier>
  modifier;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)str);
  std::operator<<(poVar1,'\n');
  modifier.value_ = str;
  pvVar2 = type_safe::
           constrained_modifier<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_type_safe::constraints::non_empty,_type_safe::assertion_verifier>
           ::get(&modifier);
  std::__cxx11::string::append((char *)pvVar2);
  type_safe::
  constrained_modifier<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_type_safe::constraints::non_empty,_type_safe::assertion_verifier>
  ::~constrained_modifier(&modifier);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  return __return_storage_ptr__;
}

Assistant:

non_empty_string func(non_empty_string str)
{
    std::cout << str.get_value() << '\n';
    // get_value() returns a const reference
    // if we want to modify it:
    {
        auto modifier = str.modify();
        modifier.get() += " suffix";
        // destructor of modifier verifies that str fulfills constraint again
    } // extra scope is important here
    return str;
}